

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

Variable __thiscall LiteScript::CreateCallback(LiteScript *this,Memory *memory,uint id)

{
  Object *this_00;
  Callback *this_01;
  uint *extraout_RDX;
  Variable VVar1;
  Callback local_d0;
  undefined1 local_1d;
  uint local_1c;
  Memory *pMStack_18;
  uint id_local;
  Memory *memory_local;
  Variable *res;
  
  local_1d = 0;
  local_1c = id;
  pMStack_18 = memory;
  memory_local = (Memory *)this;
  Memory::Create((Memory *)this,(Type *)memory);
  Callback::Callback(&local_d0,pMStack_18,local_1c);
  this_00 = Variable::operator->((Variable *)this);
  this_01 = Object::GetData<LiteScript::Callback>(this_00);
  Callback::operator=(this_01,&local_d0);
  Callback::~Callback(&local_d0);
  VVar1.nb_ref = extraout_RDX;
  VVar1.obj = (Object *)this;
  return VVar1;
}

Assistant:

LiteScript::Variable LiteScript::CreateCallback(Memory &memory, unsigned int id) {
    Variable res = memory.Create(Type::CALLBACK);
    res->GetData<Callback>() = Callback(memory, id);
    return res;
}